

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

void __thiscall soul::heart::BranchIf::visitExpressions(BranchIf *this,ExpressionVisitorFn fn)

{
  Expression *pEVar1;
  pool_ref<soul::heart::Expression> *ppVar2;
  size_t sVar3;
  long lVar4;
  pool_ref<soul::heart::Expression> arg;
  pool_ref<soul::heart::Expression> local_38;
  
  pEVar1 = (this->condition).object;
  (*(pEVar1->super_Object)._vptr_Object[3])(pEVar1,fn,0);
  std::function<void_(soul::pool_ref<soul::heart::Expression>_&,_soul::AccessType)>::operator()
            (fn,&this->condition,read);
  ppVar2 = this->targetArgs[0].items;
  sVar3 = this->targetArgs[0].numActive;
  for (lVar4 = 0; sVar3 << 3 != lVar4; lVar4 = lVar4 + 8) {
    local_38.object = *(Expression **)((long)&ppVar2->object + lVar4);
    (*((local_38.object)->super_Object)._vptr_Object[3])(local_38.object,fn,0);
    std::function<void_(soul::pool_ref<soul::heart::Expression>_&,_soul::AccessType)>::operator()
              (fn,&local_38,read);
  }
  ppVar2 = this->targetArgs[1].items;
  sVar3 = this->targetArgs[1].numActive;
  for (lVar4 = 0; sVar3 << 3 != lVar4; lVar4 = lVar4 + 8) {
    local_38.object = *(Expression **)((long)&ppVar2->object + lVar4);
    (*((local_38.object)->super_Object)._vptr_Object[3])(local_38.object,fn,0);
    std::function<void_(soul::pool_ref<soul::heart::Expression>_&,_soul::AccessType)>::operator()
              (fn,&local_38,read);
  }
  return;
}

Assistant:

void visitExpressions (ExpressionVisitorFn fn) override
        {
            condition->visitExpressions (fn, AccessType::read);
            fn (condition, AccessType::read);

            for (auto arg : targetArgs[0])
            {
                arg->visitExpressions (fn, AccessType::read);
                fn (arg, AccessType::read);
            }

            for (auto arg : targetArgs[1])
            {
                arg->visitExpressions (fn, AccessType::read);
                fn (arg, AccessType::read);
            }

        }